

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

Amount __thiscall cfd::Psbt::GetFeeAmount(Psbt *this)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  CfdException *pCVar4;
  ulong uVar5;
  int64_t *piVar6;
  undefined8 extraout_RDX;
  size_t index;
  long lVar7;
  ulong uVar8;
  long lVar9;
  Amount AVar10;
  Amount AVar11;
  allocator local_71;
  Amount local_70;
  Amount total_output;
  Amount total_input;
  
  bVar3 = HasAllUtxos(this);
  if (bVar3) {
    pvVar1 = (this->super_Psbt).wally_psbt_pointer_;
    core::Amount::Amount(&total_input);
    lVar9 = 0x20;
    lVar7 = 8;
    for (uVar8 = 0; uVar8 < *(ulong *)((long)pvVar1 + 0x18); uVar8 = uVar8 + 1) {
      piVar6 = *(int64_t **)(*(long *)((long)pvVar1 + 0x10) + lVar7);
      if (piVar6 == (int64_t *)0x0) {
        lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10) + -8 + lVar7);
        if (lVar2 == 0) {
          total_output.amount_ =
               (long)
               "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_psbt.cpp"
               + 0x61;
          total_output.ignore_check_ = true;
          total_output._9_3_ = 1;
          core::logger::warn<>((CfdSourceLocation *)&total_output,"psbt txin utxo is empty.");
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&total_output,"psbt txin utxo is empty.",&local_71)
          ;
          core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&total_output);
          __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        uVar5 = (ulong)*(uint *)(*(long *)(*(long *)((long)pvVar1 + 8) + 8) + lVar9);
        if (*(ulong *)(lVar2 + 0x28) <= uVar5) {
          total_output.amount_ =
               (long)
               "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_psbt.cpp"
               + 0x61;
          total_output.ignore_check_ = true;
          total_output._9_3_ = 1;
          core::logger::warn<>((CfdSourceLocation *)&total_output,"psbt txin vout is invalid.");
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&total_output,"psbt txin vout is invalid.",&local_71);
          core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&total_output);
          __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        piVar6 = (int64_t *)(uVar5 * 0x70 + *(long *)(lVar2 + 0x20));
      }
      core::Amount::operator+=(&total_input,*piVar6);
      lVar9 = lVar9 + 0xd0;
      lVar7 = lVar7 + 0x110;
    }
    core::Amount::Amount(&total_output);
    lVar9 = 0;
    for (uVar8 = 0; uVar8 < *(ulong *)(*(long *)((long)pvVar1 + 8) + 0x28); uVar8 = uVar8 + 1) {
      core::Amount::operator+=
                (&total_output,*(int64_t *)(*(long *)(*(long *)((long)pvVar1 + 8) + 0x20) + lVar9));
      lVar9 = lVar9 + 0x70;
    }
    bVar3 = core::operator<=(&total_input,&total_output);
    if (!bVar3) {
      AVar10 = core::operator-(&total_input,&total_output);
      local_70.ignore_check_ = AVar10.ignore_check_;
      goto LAB_0032a688;
    }
  }
  core::Amount::Amount(&local_70);
  AVar10._8_8_ = extraout_RDX;
  AVar10.amount_ = local_70.amount_;
LAB_0032a688:
  local_70.amount_ = AVar10.amount_;
  AVar11._9_7_ = AVar10._9_7_;
  AVar11.ignore_check_ = local_70.ignore_check_;
  AVar11.amount_ = local_70.amount_;
  return AVar11;
}

Assistant:

Amount Psbt::GetFeeAmount() const {
  if (!HasAllUtxos()) return Amount();
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);

  Amount total_input;
  for (size_t index = 0; index < psbt_pointer->num_inputs; ++index) {
    if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
      total_input += psbt_pointer->inputs[index].witness_utxo->satoshi;
    } else if (psbt_pointer->inputs[index].utxo != nullptr) {
      uint32_t vout = psbt_pointer->tx->inputs[index].index;
      if (psbt_pointer->inputs[index].utxo->num_outputs <= vout) {
        warn(CFD_LOG_SOURCE, "psbt txin vout is invalid.");
        throw CfdException(
            CfdError::kCfdIllegalStateError, "psbt txin vout is invalid.");
      }
      total_input += psbt_pointer->inputs[index].utxo->outputs[vout].satoshi;
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin utxo is empty.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "psbt txin utxo is empty.");
    }
  }

  Amount total_output;
  for (size_t index = 0; index < psbt_pointer->tx->num_outputs; ++index) {
    total_output += psbt_pointer->tx->outputs[index].satoshi;
  }

  if (total_input <= total_output) return Amount();
  return total_input - total_output;
}